

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall yy::parser::yy_reduce_print_(parser *this,int yyrule)

{
  char cVar1;
  short sVar2;
  ostream *poVar3;
  basic_symbol<yy::parser::by_state> *yysym;
  int local_20;
  int yyi;
  int yynrhs;
  int yylno;
  int yyrule_local;
  parser *this_local;
  
  sVar2 = *(short *)(yyrline_ + (long)yyrule * 2);
  cVar1 = yyr2_[yyrule];
  poVar3 = std::operator<<(this->yycdebug_,"Reducing stack by rule ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,yyrule + -1);
  poVar3 = std::operator<<(poVar3," (line ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)sVar2);
  std::operator<<(poVar3,"):\n");
  for (local_20 = 0; local_20 < cVar1; local_20 = local_20 + 1) {
    if (this->yydebug_ != 0) {
      poVar3 = std::operator<<(this->yycdebug_,"   $");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20 + 1);
      poVar3 = std::operator<<(poVar3," =");
      std::operator<<(poVar3,' ');
      poVar3 = this->yycdebug_;
      yysym = &stack<yy::parser::stack_symbol_type,_std::vector<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>_>
               ::operator[](&this->yystack_,(long)((int)cVar1 - (local_20 + 1)))->
               super_basic_symbol<yy::parser::by_state>;
      yy_print_<yy::parser::by_state>(this,poVar3,yysym);
      std::operator<<(this->yycdebug_,'\n');
    }
  }
  return;
}

Assistant:

void
  parser::yy_reduce_print_ (int yyrule) const
  {
    int yylno = yyrline_[yyrule];
    int yynrhs = yyr2_[yyrule];
    // Print the symbols being reduced, and their result.
    *yycdebug_ << "Reducing stack by rule " << yyrule - 1
               << " (line " << yylno << "):\n";
    // The symbols being reduced.
    for (int yyi = 0; yyi < yynrhs; yyi++)
      YY_SYMBOL_PRINT ("   $" << yyi + 1 << " =",
                       yystack_[(yynrhs) - (yyi + 1)]);
  }